

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O1

void g_template_setup(void)

{
  _class *c;
  t_pd c_00;
  undefined8 in_RAX;
  t_symbol *ptVar1;
  uint uVar3;
  ulong uVar2;
  
  uVar3 = (uint)((ulong)in_RAX >> 0x20);
  ptVar1 = gensym("template");
  template_class = class_new(ptVar1,(t_newmethod)0x0,template_free,0x30,1,A_NULL);
  c_00 = pd_canvasmaker;
  ptVar1 = gensym("struct");
  class_addmethod(c_00,template_usetemplate,ptVar1,A_GIMME,0);
  ptVar1 = gensym("struct");
  uVar2 = (ulong)uVar3 << 0x20;
  gtemplate_class = class_new(ptVar1,gtemplate_new,gtemplate_free,0x60,8,A_GIMME,uVar2);
  ptVar1 = gensym("template");
  class_addcreator(gtemplate_new_old,ptVar1,A_GIMME,0);
  ptVar1 = gensym("drawpolygon");
  uVar2 = uVar2 & 0xffffffff00000000;
  curve_class = class_new(ptVar1,curve_new,curve_free,0xf0,0,A_GIMME,uVar2);
  class_setdrawcommand(curve_class);
  ptVar1 = gensym("drawcurve");
  class_addcreator(curve_new,ptVar1,A_GIMME,0);
  ptVar1 = gensym("filledpolygon");
  class_addcreator(curve_new,ptVar1,A_GIMME,0);
  ptVar1 = gensym("filledcurve");
  class_addcreator(curve_new,ptVar1,A_GIMME,0);
  c = curve_class;
  ptVar1 = gensym("draw-shapes");
  class_sethelpsymbol(c,ptVar1);
  class_setparentwidget(curve_class,&curve_widgetbehavior);
  class_doaddfloat(curve_class,curve_float);
  ptVar1 = gensym("plot");
  uVar2 = uVar2 & 0xffffffff00000000;
  plot_class = class_new(ptVar1,plot_new,(t_method)0x0,0x240,0,A_GIMME,uVar2);
  class_setdrawcommand(plot_class);
  class_doaddfloat(plot_class,plot_float);
  class_setparentwidget(plot_class,&plot_widgetbehavior);
  ptVar1 = gensym("drawtext");
  drawnumber_class =
       class_new(ptVar1,drawnumber_new,drawnumber_free,0xe8,0,A_GIMME,uVar2 & 0xffffffff00000000);
  class_setdrawcommand(drawnumber_class);
  class_doaddfloat(drawnumber_class,drawnumber_float);
  ptVar1 = gensym("drawsymbol");
  class_addcreator(drawnumber_new,ptVar1,A_GIMME,0);
  ptVar1 = gensym("drawnumber");
  class_addcreator(drawnumber_new,ptVar1,A_GIMME,0);
  class_setparentwidget(drawnumber_class,&drawnumber_widgetbehavior);
  return;
}

Assistant:

static void template_setup(void)
{
    template_class = class_new(gensym("template"), 0, (t_method)template_free,
        sizeof(t_template), CLASS_PD, 0);
    class_addmethod(pd_canvasmaker, (t_method)template_usetemplate,
        gensym("struct"), A_GIMME, 0);

}